

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall Liby::Socket::accept(Socket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int __fd_00;
  int *piVar1;
  undefined8 *puVar2;
  char *pcVar3;
  sockaddr *__addr_00;
  undefined4 in_register_00000034;
  int clfd;
  socklen_t address_len;
  sockaddr_in address;
  undefined1 local_4d;
  int local_4c;
  Endpoint local_48;
  shared_ptr<Liby::FileDescriptor> local_40;
  socklen_t local_2c;
  sockaddr_in local_28;
  
  __fd_00 = *(int *)(CONCAT44(in_register_00000034,__fd) + 4);
  if (__fd_00 < 0) {
    __assert_fail("fd() >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Socket.cpp"
                  ,0xd,"SockPtr Liby::Socket::accept()");
  }
  local_2c = 0x10;
  local_4c = ::accept(__fd_00,(sockaddr *)&local_28,&local_2c);
  if (local_4c < 0) {
    piVar1 = __errno_location();
    if (*piVar1 == 4) {
      accept(this,__fd,__addr_00,__addr_len);
    }
    else {
      if (*piVar1 != 0xb) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar3 = strerror(*piVar1);
        *puVar2 = pcVar3;
        __cxa_throw(puVar2,&char*::typeinfo,0);
      }
      this->isUdp_ = false;
      *(undefined3 *)&this->field_0x1 = 0;
      this->fd_ = 0;
      (this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
  }
  else {
    local_40.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::FileDescriptor,std::allocator<Liby::FileDescriptor>,int&>
              (&local_40.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(FileDescriptor **)&local_40,
               (allocator<Liby::FileDescriptor> *)&local_48,&local_4c);
    Endpoint::Endpoint(&local_48,&local_28);
    this->isUdp_ = false;
    *(undefined3 *)&this->field_0x1 = 0;
    this->fd_ = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::Socket,std::allocator<Liby::Socket>,std::shared_ptr<Liby::FileDescriptor>,Liby::Endpoint>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->fp_,(Socket **)this,
               (allocator<Liby::Socket> *)&local_4d,&local_40,&local_48);
    if (local_40.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return (int)this;
}

Assistant:

SockPtr Socket::accept() {
    assert(fd() >= 0);

    struct sockaddr_in address;
    // remember to init address_len
    socklen_t address_len = sizeof(address);
    int clfd = ::accept(fd(), (struct sockaddr *)&address, &address_len);
    if (clfd < 0) {
        if (errno == EAGAIN) {
            return nullptr;
        } else if (errno == EINTR) {
            return accept();
        } else {
            auto i = errno;
            ClearUnuseVariableWarning(i);
            throw ::strerror(errno);
        }
    } else {
        return std::make_shared<Socket>(
            std::make_shared<FileDescriptor>(clfd),
            Endpoint((struct sockaddr_in *)(&address)));
    }
}